

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_> *
__thiscall
cmGeneratorTarget::GetAllConfigSources
          (vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,SourceKind kind)

{
  bool bVar1;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *this_00;
  reference __x;
  AllConfigSource *source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *__range1;
  SourceKind kind_local;
  cmGeneratorTarget *this_local;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *result;
  
  std::
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>::
  vector(__return_storage_ptr__);
  this_00 = GetAllConfigSources(this);
  __end1 = std::
           vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           ::begin(this_00);
  source = (AllConfigSource *)
           std::
           vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
           ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
                                     *)&source), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
          ::operator*(&__end1);
    if (__x->Kind == kind) {
      std::
      vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
      ::push_back(__return_storage_ptr__,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget::AllConfigSource_*,_std::vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGeneratorTarget::AllConfigSource>
cmGeneratorTarget::GetAllConfigSources(SourceKind kind) const
{
  std::vector<AllConfigSource> result;
  for (AllConfigSource const& source : this->GetAllConfigSources()) {
    if (source.Kind == kind) {
      result.push_back(source);
    }
  }
  return result;
}